

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

int lzham::lzham_lib_z_deflateReset(lzham_z_streamp pStream)

{
  lzham_z_internal_state *plVar1;
  int iVar2;
  
  iVar2 = -2;
  if ((pStream != (lzham_z_streamp)0x0) && (pStream->state != (lzham_z_internal_state *)0x0)) {
    plVar1 = (lzham_z_internal_state *)lzham_lib_compress_reinit(pStream->state);
    if (plVar1 != (lzham_z_internal_state *)0x0) {
      pStream->state = plVar1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int lzham_lib_z_deflateReset(lzham_z_streamp pStream)
   {
      if (!pStream)
      {
         LZHAM_LOG_ERROR(6034);
         return LZHAM_Z_STREAM_ERROR;
      }

      lzham_compress_state_ptr pComp = (lzham_compress_state_ptr)pStream->state;
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6035);
         return LZHAM_Z_STREAM_ERROR;
      }

      pComp = lzham_lib_compress_reinit(pComp);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6036);
         return LZHAM_Z_STREAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }